

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream)

{
  elfio *peVar1;
  pointer ppsVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  segment *psVar8;
  long lVar9;
  Elf_Half j;
  ulong uVar10;
  ulong uVar11;
  undefined **ppuVar12;
  section *psVar13;
  ulong uVar14;
  segment *seg;
  endianess_convertor *local_78;
  ulong local_70;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *local_68;
  ulong local_60;
  long local_58;
  istream *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_04;
  
  local_50 = stream;
  uVar3 = (*this->header->_vptr_elf_header[9])();
  uVar4 = (*this->header->_vptr_elf_header[0x1c])();
  iVar5 = (*this->header->_vptr_elf_header[0x1e])();
  local_58 = CONCAT44(extraout_var,iVar5);
  local_60 = (ulong)(uVar3 & 0xffff);
  local_78 = &this->convertor;
  local_68 = &this->segments_;
  local_70 = (ulong)(uVar4 & 0xffff);
  uVar10 = 0;
  while (uVar10 != local_70) {
    uVar3 = (*this->header->_vptr_elf_header[4])();
    if ((char)uVar3 == '\x01') {
      seg = (segment *)operator_new(0x68);
      ppuVar12 = &PTR__segment_impl_00112ca0;
      seg->_vptr_segment = (_func_int **)&PTR__segment_impl_00112ca0;
      seg[10]._vptr_segment = (_func_int **)0x0;
      seg[8]._vptr_segment = (_func_int **)0x0;
      seg[9]._vptr_segment = (_func_int **)0x0;
      seg[0xb]._vptr_segment = (_func_int **)local_78;
      psVar8 = seg + 7;
      *(undefined1 *)&seg[0xc]._vptr_segment = 0;
      *(undefined1 (*) [32])(seg + 2) = ZEXT432(0) << 0x40;
    }
    else {
      if ((uVar3 & 0xff) != 2) break;
      seg = (segment *)operator_new(0x80);
      ppuVar12 = &PTR__segment_impl_00112b88;
      seg->_vptr_segment = (_func_int **)&PTR__segment_impl_00112b88;
      seg[0xd]._vptr_segment = (_func_int **)0x0;
      seg[0xb]._vptr_segment = (_func_int **)0x0;
      seg[0xc]._vptr_segment = (_func_int **)0x0;
      seg[0xe]._vptr_segment = (_func_int **)local_78;
      *(undefined1 *)&seg[0xf]._vptr_segment = 0;
      *(undefined1 (*) [32])(seg + 2) = ZEXT432(0) << 0x40;
      *(undefined1 (*) [32])(seg + 5) = ZEXT432(0) << 0x40;
      psVar8 = seg + 10;
    }
    psVar8->_vptr_segment = (_func_int **)0x0;
    (*(code *)ppuVar12[0x1a])(seg,local_50,uVar10 * local_60 + local_58,0);
    local_48 = uVar10;
    (*seg->_vptr_segment[0x18])(seg,uVar10 & 0xffff);
    iVar5 = (*seg->_vptr_segment[0x11])();
    iVar6 = (*seg->_vptr_segment[0xd])();
    uVar11 = CONCAT44(extraout_var_01,iVar6) + CONCAT44(extraout_var_00,iVar5);
    local_38 = CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*seg->_vptr_segment[9])();
    iVar6 = (*seg->_vptr_segment[0xf])();
    uVar14 = CONCAT44(extraout_var_03,iVar6) + CONCAT44(extraout_var_02,iVar5);
    uVar10 = 0;
    local_40 = CONCAT44(extraout_var_02,iVar5);
    while( true ) {
      peVar1 = (this->sections).parent;
      ppsVar2 = (peVar1->sections_).
                super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(peVar1->sections_).
                    super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppsVar2;
      if (((uint)lVar9 >> 3 & 0xffff) <= uVar10) break;
      if (uVar10 < (ulong)(lVar9 >> 3)) {
        psVar13 = ppsVar2[uVar10];
      }
      else {
        psVar13 = (section *)0x0;
      }
      uVar3 = (*psVar13->_vptr_section[7])(psVar13);
      if ((uVar3 & 2) == 0) {
        iVar5 = (*psVar13->_vptr_section[0x17])();
        uVar7 = CONCAT44(extraout_var_04,iVar5);
        iVar5 = (*psVar13->_vptr_section[0x13])(psVar13);
        if (((uVar7 < uVar11) && (local_38 <= uVar7)) &&
           (CONCAT44(extraout_var_05,iVar5) + uVar7 <= uVar11)) {
LAB_0010691d:
          psVar8 = seg;
          uVar3 = (*psVar13->_vptr_section[2])(psVar13);
          (*psVar8->_vptr_segment[0x13])(psVar8,(ulong)(uVar3 & 0xffff),0);
        }
      }
      else {
        iVar5 = (*psVar13->_vptr_section[0x11])(psVar13);
        uVar7 = CONCAT44(extraout_var_06,iVar5);
        iVar5 = (*psVar13->_vptr_section[0x13])(psVar13);
        if (((uVar7 < uVar14) && (local_40 <= uVar7)) &&
           (CONCAT44(extraout_var_07,iVar5) + uVar7 <= uVar14)) goto LAB_0010691d;
      }
      uVar10 = uVar10 + 1;
    }
    std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::push_back(local_68,&seg);
    uVar10 = local_48 + 1;
  }
  return local_70 <= uVar10;
}

Assistant:

bool load_segments( std::istream& stream )
    {
        Elf_Half  entry_size = header->get_segment_entry_size();
        Elf_Half  num        = header->get_segments_num();
        Elf64_Off offset     = header->get_segments_offset();

        for ( Elf_Half i = 0; i < num; ++i ) {
            segment* seg;
            unsigned char file_class = header->get_class();

            if ( file_class == ELFCLASS64 ) {
                seg = new segment_impl<Elf64_Phdr>( &convertor );
            }
            else if ( file_class == ELFCLASS32 ) {
                seg = new segment_impl<Elf32_Phdr>( &convertor );
            }
            else {
                return false;
            }

            seg->load( stream, (std::streamoff)offset + i * entry_size );
            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr = seg->get_virtual_address();
            Elf64_Off segVEndAddr  = segVBaseAddr + seg->get_memory_size();
            for( Elf_Half j = 0; j < sections.size(); ++j ) {
                const section* psec = sections[j];

                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if( psec->get_flags() & SHF_ALLOC
                      ? is_sect_in_seg( psec->get_address(), psec->get_size(), segVBaseAddr,  segVEndAddr )
                      : is_sect_in_seg( psec->get_offset(),  psec->get_size(), segBaseOffset, segEndOffset )) {
                      // Alignment of segment shall not be updated, to preserve original value
                      // It will be re-calculated on saving.
                      seg->add_section_index( psec->get_index(), 0 );
                }
            }

            // Add section into the segments' container
            segments_.push_back( seg );
        }

        return true;
    }